

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O3

void __thiscall SM83::jr_r8<(SM83::Conditions)1>(SM83 *this)

{
  u16 addr;
  u8 uVar1;
  ushort uVar2;
  string_view fmt;
  format_args args;
  ulong local_98 [2];
  ulong local_88;
  ulong local_78;
  ulong local_68;
  ulong local_58;
  ulong local_48;
  char *local_38;
  undefined8 local_30;
  ulong local_28;
  
  addr = this->pc;
  this->pc = addr + 1;
  uVar1 = Bus::Read8(this->bus,addr,true);
  uVar2 = (short)(char)uVar1 + this->pc;
  local_98[0] = (ulong)(this->field_0).af;
  local_88 = (ulong)(this->field_1).bc;
  local_78 = (ulong)(this->field_2).de;
  local_68 = (ulong)(this->field_3).hl;
  local_58 = (ulong)this->sp;
  local_48 = (ulong)this->pc_at_opcode;
  local_38 = "C";
  local_30 = 1;
  local_28 = (ulong)uVar2;
  fmt.size_ = 0x4d;
  fmt.data_ = "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  JR {}, 0x{:04X}\n";
  args.field_1.values_ = (value<fmt::v11::context> *)local_98;
  args.desc_ = 0x2d222222;
  ::fmt::v11::vprint(fmt,args);
  if (((this->field_0).field_1.f & 0x10) != 0) {
    this->pc = uVar2;
    Timer::AdvanceCycles(this->timer,4);
  }
  return;
}

Assistant:

void SM83::jr_r8() {
    const s8 offset = static_cast<s8>(GetByteFromPC());
    const u16 new_pc = pc + offset;

    if constexpr (cond == Conditions::None) {
        LTRACE("JR 0x{:04X}", new_pc);
    } else {
        LTRACE("JR {}, 0x{:04X}", GetConditionString<cond>(), new_pc);
    }

    if (MeetsCondition<cond>()) {
        pc = new_pc;
        timer.AdvanceCycles(4);
    }
}